

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O2

void * QArrayData::allocate
                 (QArrayData **dptr,qsizetype objectSize,qsizetype alignment,qsizetype capacity,
                 AllocationOption option)

{
  AllocationResult AVar1;
  
  AVar1 = allocateHelper(objectSize,alignment,capacity,option);
  *dptr = AVar1.header;
  return AVar1.data;
}

Assistant:

void *QArrayData::allocate(QArrayData **dptr, qsizetype objectSize, qsizetype alignment,
                           qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(dptr);
    // Alignment is a power of two
    Q_ASSERT(alignment >= qsizetype(alignof(QArrayData))
            && !(alignment & (alignment - 1)));

    auto r = allocateHelper(objectSize, alignment, capacity, option);
    *dptr = r.header;
    return r.data;
}